

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  int32 iVar4;
  uint32 uVar5;
  undefined4 extraout_var;
  MapFieldBase *this;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  MapKey *value_00;
  size_t sVar7;
  MapValueRef *value_01;
  size_t sVar8;
  Descriptor *pDVar9;
  MessageOptions *this_00;
  ulong uVar10;
  int64 iVar11;
  uint64 uVar12;
  MessageLite *pMVar13;
  EnumValueDescriptor *pEVar14;
  string *local_198;
  string *value;
  string scratch;
  int j_9;
  int j_8;
  int j_7;
  int j_6;
  int j_5;
  int j_4;
  int j_3;
  int j_2;
  int j_1;
  int j;
  size_t count;
  size_t size;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  undefined1 local_98 [8];
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  size_t data_size;
  Reflection *message_reflection;
  Message *message_local;
  FieldDescriptor *field_local;
  long *plVar6;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar2);
  map_field = (MapFieldBase *)0x0;
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this = (MapFieldBase *)(**(code **)(*plVar6 + 0x2d8))(plVar6,message,field);
    bVar1 = MapFieldBase::IsMapValid(this);
    if (bVar1) {
      MapIterator::MapIterator((MapIterator *)&end.value_.type_,message,field);
      MapIterator::MapIterator((MapIterator *)local_98,message,field);
      pDVar9 = FieldDescriptor::message_type(field);
      field_00 = Descriptor::field(pDVar9,0);
      pDVar9 = FieldDescriptor::message_type(field);
      field_01 = Descriptor::field(pDVar9,1);
      (*this->_vptr_MapFieldBase[6])(this,&end.value_.type_);
      (*this->_vptr_MapFieldBase[7])(this,local_98);
      while (bVar1 = protobuf::operator!=((MapIterator *)&end.value_.type_,(MapIterator *)local_98),
            bVar1) {
        value_00 = MapIterator::GetKey((MapIterator *)&end.value_.type_);
        sVar7 = MapKeyDataOnlyByteSize(field_00,value_00);
        value_01 = MapIterator::GetValueRef((MapIterator *)&end.value_.type_);
        sVar8 = MapValueRefDataOnlyByteSize(field_01,value_01);
        sVar7 = WireFormatLite::LengthDelimitedSize(sVar7 + 2 + sVar8);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
        MapIterator::operator++((MapIterator *)&end.value_.type_);
      }
      MapIterator::~MapIterator((MapIterator *)local_98);
      MapIterator::~MapIterator((MapIterator *)&end.value_.type_);
      return (size_t)map_field;
    }
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    iVar2 = (**(code **)(*plVar6 + 0x30))(plVar6,message,field);
    _j_1 = (MapFieldBase *)FromIntSize(iVar2);
  }
  else {
    pDVar9 = FieldDescriptor::containing_type(field);
    this_00 = Descriptor::options(pDVar9);
    bVar1 = MessageOptions::map_entry(this_00);
    if (bVar1) {
      _j_1 = (MapFieldBase *)0x1;
    }
    else {
      uVar10 = (**(code **)(*plVar6 + 0x28))(plVar6,message,field);
      _j_1 = (MapFieldBase *)(ulong)((uVar10 & 1) != 0);
    }
  }
  TVar3 = FieldDescriptor::type(field);
  switch(TVar3) {
  case TYPE_DOUBLE:
    map_field = (MapFieldBase *)((long)_j_1 * 8);
    break;
  case TYPE_FLOAT:
    map_field = (MapFieldBase *)((long)_j_1 * 4);
    break;
  case TYPE_INT64:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_3 = 0; (MapFieldBase *)(long)j_3 < _j_1; j_3 = j_3 + 1) {
        iVar11 = (**(code **)(*plVar6 + 0x158))(plVar6,message,field,j_3);
        sVar7 = WireFormatLite::Int64Size(iVar11);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      iVar11 = (**(code **)(*plVar6 + 0x90))(plVar6,message,field);
      map_field = (MapFieldBase *)WireFormatLite::Int64Size(iVar11);
    }
    break;
  case TYPE_UINT64:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_7 = 0; (MapFieldBase *)(long)j_7 < _j_1; j_7 = j_7 + 1) {
        uVar12 = (**(code **)(*plVar6 + 0x168))(plVar6,message,field,j_7);
        sVar7 = WireFormatLite::UInt64Size(uVar12);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      uVar12 = (**(code **)(*plVar6 + 0xa0))(plVar6,message,field);
      map_field = (MapFieldBase *)WireFormatLite::UInt64Size(uVar12);
    }
    break;
  case TYPE_INT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_2 = 0; (MapFieldBase *)(long)j_2 < _j_1; j_2 = j_2 + 1) {
        iVar4 = (**(code **)(*plVar6 + 0x150))(plVar6,message,field,j_2);
        sVar7 = WireFormatLite::Int32Size(iVar4);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      iVar4 = (**(code **)(*plVar6 + 0x88))(plVar6,message,field);
      map_field = (MapFieldBase *)WireFormatLite::Int32Size(iVar4);
    }
    break;
  case TYPE_FIXED64:
    map_field = (MapFieldBase *)((long)_j_1 * 8);
    break;
  case TYPE_FIXED32:
    map_field = (MapFieldBase *)((long)_j_1 * 4);
    break;
  case TYPE_BOOL:
    map_field = _j_1;
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    for (scratch.field_2._8_4_ = 0; (MapFieldBase *)(long)(int)scratch.field_2._8_4_ < _j_1;
        scratch.field_2._8_4_ = scratch.field_2._8_4_ + 1) {
      std::__cxx11::string::string((string *)&value);
      bVar1 = FieldDescriptor::is_repeated(field);
      if (bVar1) {
        local_198 = (string *)
                    (**(code **)(*plVar6 + 0x1a8))
                              (plVar6,message,field,scratch.field_2._8_4_,&value);
      }
      else {
        local_198 = (string *)(**(code **)(*plVar6 + 0xe0))(plVar6,message,field,&value);
      }
      sVar7 = WireFormatLite::StringSize(local_198);
      map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      std::__cxx11::string::~string((string *)&value);
    }
    break;
  case TYPE_GROUP:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_8 = 0; (MapFieldBase *)(long)j_8 < _j_1; j_8 = j_8 + 1) {
        pMVar13 = (MessageLite *)(**(code **)(*plVar6 + 0x1a0))(plVar6,message,field,j_8);
        sVar7 = WireFormatLite::GroupSize(pMVar13);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      pMVar13 = (MessageLite *)(**(code **)(*plVar6 + 0xd8))(plVar6,message,field,0);
      map_field = (MapFieldBase *)WireFormatLite::GroupSize(pMVar13);
    }
    break;
  case TYPE_MESSAGE:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_9 = 0; (MapFieldBase *)(long)j_9 < _j_1; j_9 = j_9 + 1) {
        pMVar13 = (MessageLite *)(**(code **)(*plVar6 + 0x1a0))(plVar6,message,field,j_9);
        sVar7 = WireFormatLite::MessageSize(pMVar13);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      pMVar13 = (MessageLite *)(**(code **)(*plVar6 + 0xd8))(plVar6,message,field,0);
      map_field = (MapFieldBase *)WireFormatLite::MessageSize(pMVar13);
    }
    break;
  case TYPE_UINT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_6 = 0; (MapFieldBase *)(long)j_6 < _j_1; j_6 = j_6 + 1) {
        uVar5 = (**(code **)(*plVar6 + 0x160))(plVar6,message,field,j_6);
        sVar7 = WireFormatLite::UInt32Size(uVar5);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      uVar5 = (**(code **)(*plVar6 + 0x98))(plVar6,message,field);
      map_field = (MapFieldBase *)WireFormatLite::UInt32Size(uVar5);
    }
    break;
  case TYPE_ENUM:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (scratch.field_2._12_4_ = 0; (MapFieldBase *)(long)(int)scratch.field_2._12_4_ < _j_1;
          scratch.field_2._12_4_ = scratch.field_2._12_4_ + 1) {
        pEVar14 = (EnumValueDescriptor *)
                  (**(code **)(*plVar6 + 400))(plVar6,message,field,scratch.field_2._12_4_);
        iVar2 = EnumValueDescriptor::number(pEVar14);
        sVar7 = WireFormatLite::EnumSize(iVar2);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      pEVar14 = (EnumValueDescriptor *)(**(code **)(*plVar6 + 200))(plVar6,message,field);
      iVar2 = EnumValueDescriptor::number(pEVar14);
      map_field = (MapFieldBase *)WireFormatLite::EnumSize(iVar2);
    }
    break;
  case TYPE_SFIXED32:
    map_field = (MapFieldBase *)((long)_j_1 * 4);
    break;
  case TYPE_SFIXED64:
    map_field = (MapFieldBase *)((long)_j_1 * 8);
    break;
  case TYPE_SINT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_4 = 0; (MapFieldBase *)(long)j_4 < _j_1; j_4 = j_4 + 1) {
        iVar4 = (**(code **)(*plVar6 + 0x150))(plVar6,message,field,j_4);
        sVar7 = WireFormatLite::SInt32Size(iVar4);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      iVar4 = (**(code **)(*plVar6 + 0x88))(plVar6,message,field);
      map_field = (MapFieldBase *)WireFormatLite::SInt32Size(iVar4);
    }
    break;
  case MAX_TYPE:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_5 = 0; (MapFieldBase *)(long)j_5 < _j_1; j_5 = j_5 + 1) {
        iVar11 = (**(code **)(*plVar6 + 0x158))(plVar6,message,field,j_5);
        sVar7 = WireFormatLite::SInt64Size(iVar11);
        map_field = (MapFieldBase *)((long)&map_field->_vptr_MapFieldBase + sVar7);
      }
    }
    else {
      iVar11 = (**(code **)(*plVar6 + 0x90))(plVar6,message,field);
      map_field = (MapFieldBase *)WireFormatLite::SInt64Size(iVar11);
    }
  }
  return (size_t)map_field;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    MapFieldBase* map_field =
        message_reflection->MapData(const_cast<Message*>(&message), field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                     \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      if (field->is_repeated()) {                                          \
        for (int j = 0; j < count; j++) {                                  \
          data_size += WireFormatLite::TYPE_METHOD##Size(                  \
            message_reflection->GetRepeated##CPPTYPE_METHOD(               \
              message, field, j));                                         \
        }                                                                  \
      } else {                                                             \
        data_size += WireFormatLite::TYPE_METHOD##Size(                    \
          message_reflection->Get##CPPTYPE_METHOD(message, field));        \
      }                                                                    \
      break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                               \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      data_size += count * WireFormatLite::k##TYPE_METHOD##Size;           \
      break;

    HANDLE_TYPE( INT32,  Int32,  Int32)
    HANDLE_TYPE( INT64,  Int64,  Int64)
    HANDLE_TYPE(SINT32, SInt32,  Int32)
    HANDLE_TYPE(SINT64, SInt64,  Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE( FIXED32,  Fixed32)
    HANDLE_FIXED_TYPE( FIXED64,  Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT , Float )
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP  , Group  , Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
            message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
          message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}